

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_string_rec(rf_font font,char *text,int text_len,rf_rec rec,float font_size,
                       float spacing,rf_text_wrap_mode wrap,rf_color tint)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  rf_int rVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  rf_rec source_rec;
  rf_rec dest_rec;
  rf_decoded_rune decoded_rune;
  ulong local_128;
  int local_10c;
  float local_f8;
  float fStack_f4;
  float local_78;
  float fStack_74;
  rf_decoded_rune local_48;
  
  if (0 < text_len) {
    fVar20 = font_size / (float)font.base_size;
    lVar13 = (long)text_len;
    bVar18 = wrap != RF_WORD_WRAP;
    iVar4 = (int)((float)(font.base_size / 2 + font.base_size) * fVar20);
    fStack_f4 = rec.height;
    iVar12 = 0;
    iVar16 = 0;
    local_128 = 0xffffffff;
    uVar6 = 0;
    local_10c = -1;
    do {
      rf_decode_utf8_char(&local_48,text + uVar6,lVar13 - uVar6);
      lVar9 = -1;
      if (0 < font.glyphs_count) {
        lVar10 = 0;
        piVar14 = &(font.glyphs)->codepoint;
        rVar15 = font.glyphs_count;
        do {
          if (*piVar14 == local_48.codepoint) {
            lVar9 = lVar10 >> 0x20;
            break;
          }
          lVar10 = lVar10 + 0x100000000;
          piVar14 = piVar14 + 8;
          rVar15 = rVar15 + -1;
        } while (rVar15 != 0);
      }
      local_f8 = rec.width;
      lVar10 = 1;
      uVar17 = uVar6;
      if ((local_48.codepoint == 0x3f) ||
         (uVar17 = (local_48.bytes_processed + uVar6) - 1, lVar10 = local_48.bytes_processed,
         local_48.codepoint != 10)) {
        if (font.glyphs[lVar9].advance_x == 0) {
          fVar19 = font.glyphs[lVar9].field_0.rec.width;
        }
        else {
          fVar19 = (float)font.glyphs[lVar9].advance_x;
        }
        iVar11 = (int)(fVar19 * fVar20 + spacing);
        if (!bVar18) {
          bVar18 = false;
          goto LAB_0014cf1b;
        }
        if ((wrap == RF_CHAR_WRAP) && (local_f8 <= (float)(iVar12 + iVar11 + 1))) {
          iVar16 = iVar16 + iVar4;
          iVar12 = 0;
        }
        if (fStack_f4 < (float)((int)((float)font.base_size * fVar20) + iVar16)) {
          return;
        }
        uVar5 = uVar17;
        if ((local_48.codepoint != 9) && (local_48.codepoint != 0x20)) {
          local_78 = rec.x;
          fStack_74 = rec.y;
          uVar1 = font.glyphs[lVar9].offset_x;
          uVar3 = font.glyphs[lVar9].offset_y;
          dest_rec.x = (float)(int)uVar1 * fVar20 + (float)iVar12 + local_78;
          dest_rec.y = (float)(int)uVar3 * fVar20 + (float)iVar16 + fStack_74;
          uVar2 = *(undefined8 *)((long)&font.glyphs[lVar9].field_0 + 8);
          dest_rec.width = fVar20 * (float)uVar2;
          dest_rec.height = fVar20 * (float)((ulong)uVar2 >> 0x20);
          source_rec.width = (float)(int)uVar2;
          source_rec.height = (float)(int)((ulong)uVar2 >> 0x20);
          source_rec._0_8_ = *(undefined8 *)&font.glyphs[lVar9].field_0;
          rf_draw_texture_region(font.texture,source_rec,dest_rec,(rf_vec2)0x0,0.0,tint);
        }
LAB_0014ced1:
        bVar18 = true;
        uVar17 = uVar5;
        if ((wrap == RF_CHAR_WRAP) || (iVar7 = (int)local_128, uVar5 != (long)iVar7))
        goto LAB_0014cfb4;
        iVar16 = iVar16 + iVar4;
        bVar18 = false;
        local_128 = 0xffffffff;
        local_10c = iVar7;
LAB_0014cfb2:
        iVar11 = 0;
        iVar12 = 0;
        uVar17 = uVar5;
      }
      else {
        if (!bVar18) {
          bVar18 = true;
          iVar11 = 0;
LAB_0014cf1b:
          if ((local_48.codepoint < 0x21) &&
             ((0x100000600U >> ((ulong)local_48.codepoint & 0x3f) & 1) != 0)) {
            local_128 = uVar17 & 0xffffffff;
          }
          uVar5 = (ulong)local_10c;
          if (local_f8 <= (float)(iVar11 + iVar12 + 1)) {
            iVar12 = (int)local_128;
            if ((int)local_128 < 1) {
              iVar12 = (int)uVar17;
            }
            lVar9 = 0;
            if (uVar17 == (long)iVar12) {
              lVar9 = lVar10;
            }
            uVar8 = iVar12 - (int)lVar9;
            if (lVar10 + uVar5 == (long)(int)uVar8) {
              uVar8 = (int)uVar17 - (int)lVar10;
            }
            local_128 = (ulong)uVar8;
          }
          else if (lVar10 + uVar6 == lVar13) {
            local_128 = uVar17 & 0xffffffff;
          }
          else if (!bVar18) {
            bVar18 = false;
            goto LAB_0014cfb4;
          }
          bVar18 = true;
          goto LAB_0014cfb2;
        }
        if (wrap != RF_CHAR_WRAP) {
          iVar11 = 0;
          uVar5 = uVar17;
          goto LAB_0014ced1;
        }
        iVar16 = iVar16 + iVar4;
        iVar11 = 0;
        bVar18 = true;
        iVar12 = 0;
      }
LAB_0014cfb4:
      iVar12 = iVar11 + iVar12;
      uVar6 = uVar17 + 1;
    } while ((long)uVar6 < lVar13);
  }
  return;
}

Assistant:

RF_API void rf_draw_string_rec(rf_font font, const char* text, int text_len, rf_rec rec, float font_size, float spacing, rf_text_wrap_mode wrap, rf_color tint)
{
    int   text_offset_x = 0; // Offset between characters
    int   text_offset_y = 0; // Required for line break!
    float scale_factor  = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size/font.base_size;

    enum
    {
        MEASURE_WORD_WRAP_STATE = 0,
        MEASURE_RESULT_STATE = 1
    };

    int state      = wrap == RF_WORD_WRAP ? MEASURE_WORD_WRAP_STATE : MEASURE_RESULT_STATE;
    int start_line = -1; // Index where to begin drawing (where a line begins)
    int end_line   = -1; // Index where to stop drawing (where a line ends)
    int lastk      = -1; // Holds last value of the character position

    for (rf_int i = 0, k = 0; i < text_len; i++, k++)
    {
        int glyph_width = 0;

        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index  = rf_get_glyph_index(font, letter);

        // NOTE: normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set next = 1
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += decoded_rune.bytes_processed - 1;

        if (letter != '\n')
        {
            glyph_width = (font.glyphs[index].advance_x == 0)?
                          (int)(font.glyphs[index].width*scale_factor + spacing):
                          (int)(font.glyphs[index].advance_x*scale_factor + spacing);
        }

        // NOTE: When wrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in start_line and end_line, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_WORD_WRAP_STATE)
        {
            // TODO: there are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // See: http://jkorpela.fi/chars/spaces.html
            if ((letter == ' ') || (letter == '\t') || (letter == '\n')) end_line = i;

            if ((text_offset_x + glyph_width + 1) >= rec.width)
            {
                end_line = (end_line < 1)? i : end_line;
                if (i == end_line) end_line -= decoded_rune.bytes_processed;
                if ((start_line + decoded_rune.bytes_processed) == end_line) end_line = i - decoded_rune.bytes_processed;
                state = !state;
            }
            else if ((i + 1) == text_len)
            {
                end_line = i;
                state = !state;
            }
            else if (letter == '\n')
            {
                state = !state;
            }

            if (state == MEASURE_RESULT_STATE)
            {
                text_offset_x = 0;
                i = start_line;
                glyph_width = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (letter == '\n')
            {
                if (!wrap)
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }
            }
            else
            {
                if (!wrap && ((text_offset_x + glyph_width + 1) >= rec.width))
                {
                    text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                    text_offset_x = 0;
                }

                if ((text_offset_y + (int)(font.base_size*scale_factor)) > rec.height) break;

                // Draw glyph
                if ((letter != ' ') && (letter != '\t'))
                {
                    rf_draw_texture_region(font.texture, font.glyphs[index].rec,
                                           (rf_rec) {
                                               rec.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                               rec.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                               font.glyphs[index].width  * scale_factor,
                                               font.glyphs[index].height * scale_factor
                                           },
                                           (rf_vec2){ 0, 0 }, 0.0f, tint);
                }
            }

            if (wrap && (i == end_line))
            {
                text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
                text_offset_x = 0;
                start_line = end_line;
                end_line = -1;
                glyph_width = 0;
                k = lastk;
                state = !state;
            }
        }

        text_offset_x += glyph_width;
    }
}